

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O0

void P_SectorDamage(int tag,int amount,FName *type,PClassActor *protectClass,int flags)

{
  uint uVar1;
  sector_t *sec_00;
  AActor *pAVar2;
  bool bVar3;
  uint uVar4;
  sector_t **ppsVar5;
  double dVar6;
  FName local_74;
  double local_70;
  double zz;
  double z2;
  double z1;
  sector_t *sec2;
  uint i;
  sector_t *sec;
  AActor *next;
  AActor *actor;
  int secnum;
  FSectorTagIterator itr;
  int flags_local;
  PClassActor *protectClass_local;
  FName *type_local;
  int amount_local;
  int tag_local;
  
  itr.searchtag = flags;
  unique0x10000205 = protectClass;
  FSectorTagIterator::FSectorTagIterator((FSectorTagIterator *)((long)&actor + 4),tag);
  while (actor._0_4_ = FSectorTagIterator::Next((FSectorTagIterator *)((long)&actor + 4)),
        -1 < (int)actor) {
    _i = sectors + (int)actor;
    next = _i->thinglist;
    while (pAVar2 = next, sec_00 = _i, next != (AActor *)0x0) {
      sec = (sector_t *)next->snext;
      FName::FName((FName *)((long)&sec2 + 4),type);
      DoSectorDamage(pAVar2,sec_00,amount,(FName *)((long)&sec2 + 4),stack0xffffffffffffffe0,
                     itr.searchtag);
      next = (AActor *)sec;
    }
    for (sec2._0_4_ = 0; uVar1 = (uint)sec2,
        uVar4 = TArray<sector_t_*,_sector_t_*>::Size(&(_i->e->XFloor).attached), uVar1 < uVar4;
        sec2._0_4_ = (uint)sec2 + 1) {
      ppsVar5 = TArray<sector_t_*,_sector_t_*>::operator[]
                          (&(_i->e->XFloor).attached,(ulong)(uint)sec2);
      z1 = (double)*ppsVar5;
      next = ((sector_t *)z1)->thinglist;
      while (next != (AActor *)0x0) {
        sec = (sector_t *)next->snext;
        z2 = secplane_t::ZatPoint(&_i->floorplane,next);
        dVar6 = secplane_t::ZatPoint(&_i->ceilingplane,next);
        zz = dVar6;
        if (dVar6 < z2) {
          local_70 = z2;
          zz = z2;
          z2 = dVar6;
        }
        dVar6 = AActor::Top(next);
        if ((z2 < dVar6) &&
           (((itr.searchtag & 4U) != 0 || (bVar3 = AActor::isAbove(next,zz), !bVar3)))) {
          pAVar2 = next;
          FName::FName(&local_74,type);
          DoSectorDamage(pAVar2,(sector_t *)0x0,amount,&local_74,stack0xffffffffffffffe0,
                         itr.searchtag | 4);
        }
        next = (AActor *)sec;
      }
    }
  }
  return;
}

Assistant:

void P_SectorDamage(int tag, int amount, FName type, PClassActor *protectClass, int flags)
{
	FSectorTagIterator itr(tag);
	int secnum;
	while ((secnum = itr.Next()) >= 0)
	{
		AActor *actor, *next;
		sector_t *sec = &sectors[secnum];

		// Do for actors in this sector.
		for (actor = sec->thinglist; actor != NULL; actor = next)
		{
			next = actor->snext;
			DoSectorDamage(actor, sec, amount, type, protectClass, flags);
		}
		// If this is a 3D floor control sector, also do for anything in/on
		// those 3D floors.
		for (unsigned i = 0; i < sec->e->XFloor.attached.Size(); ++i)
		{
			sector_t *sec2 = sec->e->XFloor.attached[i];

			for (actor = sec2->thinglist; actor != NULL; actor = next)
			{
				next = actor->snext;
				// Only affect actors touching the 3D floor
				double z1 = sec->floorplane.ZatPoint(actor);
				double z2 = sec->ceilingplane.ZatPoint(actor);
				if (z2 < z1)
				{
					// Account for Vavoom-style 3D floors
					double zz = z1;
					z1 = z2;
					z2 = zz;
				}
				if (actor->Top() > z1)
				{
					// If DAMAGE_IN_AIR is used, anything not beneath the 3D floor will be
					// damaged (so, anything touching it or above it). Other 3D floors between
					// the actor and this one will not stop this effect.
					if ((flags & DAMAGE_IN_AIR) || !actor->isAbove(z2))
					{
						// Here we pass the DAMAGE_IN_AIR flag to disable the floor check, since it
						// only works with the real sector's floor. We did the appropriate height checks
						// for 3D floors already.
						DoSectorDamage(actor, NULL, amount, type, protectClass, flags | DAMAGE_IN_AIR);
					}
				}
			}
		}
	}
}